

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InvalidInputException::
InvalidInputException<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
          (InvalidInputException *this,string *msg,MultiFileLocalColumnId params,
          unsigned_long params_1,unsigned_long params_2)

{
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<duckdb::MultiFileLocalColumnId,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)params.column_id,(MultiFileLocalColumnId)params_1,
             params_2,in_R9);
  InvalidInputException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}